

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpc_analyzer.cc
# Opt level: O0

float __thiscall sptk::reaper::LpcAnalyzer::WindowedRms(LpcAnalyzer *this,float *data,int size)

{
  reference pvVar1;
  int in_EDX;
  float *in_RSI;
  vector<float,_std::allocator<float>_> *in_RDI;
  double dVar2;
  int i;
  float f;
  float sum;
  int local_20;
  float local_18;
  float *local_10;
  
  GetWindow((LpcAnalyzer *)CONCAT44(size,sum),(int)f);
  local_18 = 0.0;
  local_10 = in_RSI;
  for (local_20 = 0; local_20 < in_EDX; local_20 = local_20 + 1) {
    pvVar1 = std::vector<float,_std::allocator<float>_>::operator[](in_RDI,(long)local_20);
    local_18 = *pvVar1 * *local_10 * *pvVar1 * *local_10 + local_18;
    local_10 = local_10 + 1;
  }
  dVar2 = std::sqrt((double)(ulong)(uint)(local_18 / (float)in_EDX));
  return SUB84(dVar2,0);
}

Assistant:

float LpcAnalyzer::WindowedRms(float* data, int size) {
  float sum, f;
  int i;

  GetWindow(size);
  for (i = 0, sum = 0.0; i < size; i++) {
    f = energywind_[i] * (*data++);
    sum += f * f;
  }
  return sqrt(sum / size);
}